

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

void ImGui::BulletTextV(char *fmt,__va_list_tag *args)

{
  bool bVar1;
  int iVar2;
  float fVar3;
  float fVar4;
  ImVec2 IVar5;
  ImU32 text_col;
  ImRect bb;
  ImVec2 pos;
  ImVec2 total_size;
  ImVec2 label_size;
  char *text_end;
  char *text_begin;
  ImGuiStyle *style;
  ImGuiContext *g;
  ImGuiWindow *window;
  ImVec2 *in_stack_ffffffffffffff38;
  ImDrawList *draw_list;
  __va_list_tag *in_stack_ffffffffffffff40;
  ImVec2 IVar6;
  char *in_stack_ffffffffffffff48;
  size_t in_stack_ffffffffffffff50;
  char *in_stack_ffffffffffffff58;
  ImRect *nav_bb_arg;
  undefined4 in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff64;
  ImRect *bb_00;
  ImVec2 local_8c;
  int in_stack_ffffffffffffff84;
  int in_stack_ffffffffffffff88;
  float fVar7;
  float fVar8;
  ImVec2 local_68;
  ImRect local_60;
  ImVec2 local_50;
  ImRect local_48;
  char *local_38;
  char *local_30;
  ImGuiStyle *local_28;
  ImGuiContext *local_20;
  ImGuiWindow *local_18;
  
  local_18 = GetCurrentWindow();
  if ((local_18->SkipItems & 1U) == 0) {
    local_20 = GImGui;
    local_28 = &GImGui->Style;
    bb_00 = (ImRect *)GImGui->TempBuffer;
    local_30 = (char *)bb_00;
    iVar2 = ImFormatStringV(in_stack_ffffffffffffff58,in_stack_ffffffffffffff50,
                            in_stack_ffffffffffffff48,in_stack_ffffffffffffff40);
    local_38 = (char *)((long)&(bb_00->Min).x + (long)iVar2);
    local_48.Max = CalcTextSize((char *)bb_00,
                                (char *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60
                                                ),SUB81((ulong)in_stack_ffffffffffffff58 >> 0x38,0),
                                SUB84(in_stack_ffffffffffffff58,0));
    if (local_48.Max.x <= 0.0) {
      fVar4 = 0.0;
    }
    else {
      fVar4 = (local_28->FramePadding).x;
      fVar4 = fVar4 + fVar4 + local_48.Max.x;
    }
    nav_bb_arg = &local_48;
    ImVec2::ImVec2(&nav_bb_arg->Min,local_20->FontSize + fVar4,local_48.Max.y);
    IVar6 = (local_18->DC).CursorPos;
    local_50.y = IVar6.y;
    local_50.x = IVar6.x;
    local_50.y = local_50.y + (local_18->DC).CurrLineTextBaseOffset;
    ItemSize((ImVec2 *)CONCAT44(fVar4,in_stack_ffffffffffffff60),(float)((ulong)nav_bb_arg >> 0x20))
    ;
    local_68 = operator+(in_stack_ffffffffffffff38,(ImVec2 *)0x19639e);
    ImRect::ImRect(&local_60,&local_50,&local_68);
    bVar1 = ItemAdd(bb_00,(ImGuiID)fVar4,nav_bb_arg,
                    (ImGuiItemFlags)(in_stack_ffffffffffffff50 >> 0x20));
    if (bVar1) {
      fVar3 = (float)GetColorU32((ImGuiCol)(in_stack_ffffffffffffff50 >> 0x20),
                                 (float)in_stack_ffffffffffffff50);
      IVar6 = (ImVec2)local_18->DrawList;
      fVar4 = local_20->FontSize * 0.5;
      draw_list = (ImDrawList *)&stack0xffffffffffffff84;
      ImVec2::ImVec2((ImVec2 *)draw_list,fVar4 + (local_28->FramePadding).x,fVar4);
      IVar5 = operator+((ImVec2 *)draw_list,(ImVec2 *)0x19644b);
      fVar7 = IVar5.x;
      fVar8 = IVar5.y;
      RenderBullet(draw_list,IVar6,0);
      fVar4 = (local_28->FramePadding).x;
      ImVec2::ImVec2(&local_8c,fVar4 + fVar4 + local_20->FontSize,0.0);
      IVar5 = operator+((ImVec2 *)draw_list,(ImVec2 *)0x1964ab);
      IVar6.y = fVar3;
      IVar6.x = fVar8;
      RenderText(IVar6,(char *)CONCAT44(fVar7,in_stack_ffffffffffffff88),
                 (char *)CONCAT44(in_stack_ffffffffffffff84,IVar5.y),IVar5.x._3_1_);
    }
  }
  return;
}

Assistant:

void ImGui::BulletTextV(const char* fmt, va_list args)
{
    ImGuiWindow* window = GetCurrentWindow();
    if (window->SkipItems)
        return;

    ImGuiContext& g = *GImGui;
    const ImGuiStyle& style = g.Style;

    const char* text_begin = g.TempBuffer;
    const char* text_end = text_begin + ImFormatStringV(g.TempBuffer, IM_ARRAYSIZE(g.TempBuffer), fmt, args);
    const ImVec2 label_size = CalcTextSize(text_begin, text_end, false);
    const ImVec2 total_size = ImVec2(g.FontSize + (label_size.x > 0.0f ? (label_size.x + style.FramePadding.x * 2) : 0.0f), label_size.y);  // Empty text doesn't add padding
    ImVec2 pos = window->DC.CursorPos;
    pos.y += window->DC.CurrLineTextBaseOffset;
    ItemSize(total_size, 0.0f);
    const ImRect bb(pos, pos + total_size);
    if (!ItemAdd(bb, 0))
        return;

    // Render
    ImU32 text_col = GetColorU32(ImGuiCol_Text);
    RenderBullet(window->DrawList, bb.Min + ImVec2(style.FramePadding.x + g.FontSize * 0.5f, g.FontSize * 0.5f), text_col);
    RenderText(bb.Min + ImVec2(g.FontSize + style.FramePadding.x * 2, 0.0f), text_begin, text_end, false);
}